

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

void udiv_urem_bv(BtorSimBitVector *a,BtorSimBitVector *b,BtorSimBitVector **q,BtorSimBitVector **r)

{
  _Bool _Var1;
  uint32_t uVar2;
  BtorSimBitVector *a_00;
  BtorSimBitVector *__ptr;
  BtorSimBitVector *a_01;
  BtorSimBitVector *pBVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  BtorSimBitVector *in_RSI;
  BtorSimBitVector *in_RDI;
  BtorSimBitVector *tmp;
  BtorSimBitVector *eq;
  BtorSimBitVector *ult;
  BtorSimBitVector *rem;
  BtorSimBitVector *quot;
  BtorSimBitVector *neg_b;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  _Bool is_true;
  int64_t i;
  undefined4 in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  uint64_t in_stack_ffffffffffffff80;
  BtorSimBitVector *b_00;
  BtorSimBitVector *in_stack_ffffffffffffff90;
  ulong local_28;
  
  if (in_RDI->width < 0x41) {
    btorsim_bv_to_uint64(in_RDI);
    btorsim_bv_to_uint64(in_RSI);
    a_00 = btorsim_bv_uint64_to_bv(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    __ptr = btorsim_bv_uint64_to_bv(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  else {
    a_01 = btorsim_bv_neg(in_stack_ffffffffffffff90);
    uVar2 = (uint32_t)(in_stack_ffffffffffffff80 >> 0x20);
    a_00 = btorsim_bv_new(uVar2);
    __ptr = btorsim_bv_new(uVar2);
    for (local_28 = (ulong)(in_RDI->width - 1); -1 < (long)local_28; local_28 = local_28 - 1) {
      pBVar3 = sll_bv(a_00,(uint32_t)((ulong)__ptr >> 0x20));
      free(__ptr);
      b_00 = pBVar3;
      __ptr = pBVar3;
      uVar2 = btorsim_bv_get_bit(in_RDI,(uint32_t)local_28);
      btorsim_bv_set_bit(pBVar3,0,uVar2);
      pBVar3 = btorsim_bv_ult(in_stack_ffffffffffffff90,b_00);
      _Var1 = btorsim_bv_is_true((BtorSimBitVector *)
                                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      free(pBVar3);
      pBVar3 = __ptr;
      if (_Var1) {
LAB_0013af5d:
        __ptr = btorsim_bv_add(a_01,a_00);
        free(pBVar3);
        btorsim_bv_set_bit(a_00,(uint32_t)local_28,1);
      }
      else {
        in_stack_ffffffffffffff90 = btorsim_bv_eq(in_stack_ffffffffffffff90,b_00);
        _Var1 = btorsim_bv_is_true((BtorSimBitVector *)
                                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        free(in_stack_ffffffffffffff90);
        pBVar3 = __ptr;
        if (_Var1) goto LAB_0013af5d;
      }
    }
    free(a_01);
  }
  if (in_RDX == (undefined8 *)0x0) {
    free(a_00);
  }
  else {
    *in_RDX = a_00;
  }
  if (in_RCX == (undefined8 *)0x0) {
    free(__ptr);
  }
  else {
    *in_RCX = __ptr;
  }
  return;
}

Assistant:

static void
udiv_urem_bv (const BtorSimBitVector *a,
              const BtorSimBitVector *b,
              BtorSimBitVector **q,
              BtorSimBitVector **r)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  int64_t i;
  bool is_true;
  uint64_t x, y, z;

  BtorSimBitVector *neg_b, *quot, *rem, *ult, *eq, *tmp;

  if (a->width <= 64)
  {
    x = btorsim_bv_to_uint64 (a);
    y = btorsim_bv_to_uint64 (b);
    if (y == 0)
    {
      y = x;
      x = UINT64_MAX;
    }
    else
    {
      z = x / y;
      y = x % y;
      x = z;
    }
    quot = btorsim_bv_uint64_to_bv (x, a->width);
    rem  = btorsim_bv_uint64_to_bv (y, a->width);
  }
  else
  {
    neg_b = btorsim_bv_neg (b);
    quot  = btorsim_bv_new (a->width);
    rem   = btorsim_bv_new (a->width);

    for (i = a->width - 1; i >= 0; i--)
    {
      tmp = sll_bv (rem, 1);
      free (rem);
      rem = tmp;
      btorsim_bv_set_bit (rem, 0, btorsim_bv_get_bit (a, i));

      ult     = btorsim_bv_ult (b, rem);
      is_true = btorsim_bv_is_true (ult);
      free (ult);

      if (is_true) goto UDIV_UREM_SUBTRACT;

      eq      = btorsim_bv_eq (b, rem);
      is_true = btorsim_bv_is_true (eq);
      free (eq);

      if (is_true)
      {
      UDIV_UREM_SUBTRACT:
        tmp = btorsim_bv_add (rem, neg_b);
        free (rem);
        rem = tmp;
        btorsim_bv_set_bit (quot, i, 1);
      }
    }
    free (neg_b);
  }

  if (q)
    *q = quot;
  else
    free (quot);

  if (r)
    *r = rem;
  else
    free (rem);
}